

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O2

base_learner * gd_mf_setup(options_i *options,vw *all)

{
  element_type *peVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  typed_option<unsigned_long> *ptVar5;
  element_type eVar6;
  learner<gdmf,_example> *plVar7;
  vw_exception *pvVar8;
  uint32_t *puVar9;
  float fVar10;
  allocator local_4ec;
  allocator local_4eb;
  bool conjugate_gradient;
  bool bfgs;
  string local_4e8 [32];
  free_ptr<gdmf> data;
  stringstream __msg;
  undefined1 local_4a8 [96];
  bool local_448;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  option_group_definition gf_md_options;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  typed_option<bool> local_1f8;
  typed_option<bool> local_158;
  typed_option<unsigned_int> local_b8;
  
  scoped_calloc_or_throw<gdmf>();
  bfgs = false;
  conjugate_gradient = false;
  std::__cxx11::string::string
            ((string *)&local_2d0,"Gradient Descent Matrix Factorization",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&gf_md_options,&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::string((string *)&local_2f0,"rank",&local_4eb);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)&__msg,&local_2f0,
             &(data._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Head_base<0UL,_gdmf_*,_false>
              ._M_head_impl)->rank);
  local_448 = true;
  std::__cxx11::string::string(local_4e8,"rank for matrix factorization.",&local_4ec);
  std::__cxx11::string::_M_assign((string *)(local_4a8 + 0x20));
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_b8,(typed_option<unsigned_int> *)&__msg);
  VW::config::option_group_definition::add<unsigned_int>(&gf_md_options,&local_b8);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_b8);
  std::__cxx11::string::~string(local_4e8);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)&__msg);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::string((string *)&local_310,"bfgs",&local_4eb);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)&__msg,&local_310,&bfgs);
  std::__cxx11::string::string(local_4e8,"Option not supported by this reduction",&local_4ec);
  std::__cxx11::string::_M_assign((string *)(local_4a8 + 0x20));
  VW::config::typed_option<bool>::typed_option(&local_158,(typed_option<bool> *)&__msg);
  VW::config::option_group_definition::add<bool>(&gf_md_options,&local_158);
  VW::config::typed_option<bool>::~typed_option(&local_158);
  std::__cxx11::string::~string(local_4e8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::string((string *)&local_330,"conjugate_gradient",&local_4eb);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)&__msg,&local_330,&conjugate_gradient);
  std::__cxx11::string::string(local_4e8,"Option not supported by this reduction",&local_4ec);
  std::__cxx11::string::_M_assign((string *)(local_4a8 + 0x20));
  VW::config::typed_option<bool>::typed_option(&local_1f8,(typed_option<bool> *)&__msg);
  VW::config::option_group_definition::add<bool>(&gf_md_options,&local_1f8);
  VW::config::typed_option<bool>::~typed_option(&local_1f8);
  std::__cxx11::string::~string(local_4e8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)&local_330);
  (**options->_vptr_options_i)(options,&gf_md_options);
  std::__cxx11::string::string((string *)&__msg,"rank",(allocator *)local_4e8);
  iVar4 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar4 == '\0') {
    plVar7 = (learner<gdmf,_example> *)0x0;
  }
  else {
    std::__cxx11::string::string((string *)&__msg,"adaptive",(allocator *)local_4e8);
    iVar4 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar4 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_4a8,"adaptive is not implemented for matrix factorization");
      pvVar8 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/gd_mf.cc"
                 ,0x15b,&local_218);
      __cxa_throw(pvVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::__cxx11::string::string((string *)&__msg,"normalized",(allocator *)local_4e8);
    iVar4 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar4 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_4a8,"normalized is not implemented for matrix factorization")
      ;
      pvVar8 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/gd_mf.cc"
                 ,0x15d,&local_238);
      __cxa_throw(pvVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::__cxx11::string::string((string *)&__msg,"exact_adaptive_norm",(allocator *)local_4e8);
    iVar4 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar4 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_4a8,
                      "normalized adaptive updates is not implemented for matrix factorization");
      pvVar8 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/gd_mf.cc"
                 ,0x15f,&local_258);
      __cxa_throw(pvVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    if ((bfgs != false) || (conjugate_gradient == true)) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_4a8,"bfgs is not implemented for matrix factorization");
      pvVar8 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/gd_mf.cc"
                 ,0x162,&local_278);
      __cxa_throw(pvVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    (data._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Head_base<0UL,_gdmf_*,_false>.
    _M_head_impl)->all = all;
    (data._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Head_base<0UL,_gdmf_*,_false>.
    _M_head_impl)->no_win_counter = 0;
    fVar10 = logf((float)((data._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
                           super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.
                           super__Head_base<0UL,_gdmf_*,_false>._M_head_impl)->rank * 2 + 1));
    fVar10 = ceilf(fVar10 / 0.6931472);
    parameters::stride_shift
              (&all->weights,
               (uint)(long)fVar10 |
               (uint)(long)(fVar10 - 9.223372e+18) & (uint)((long)fVar10 >> 0x3f));
    all->random_weights = true;
    if (all->holdout_set_off == false) {
      all->sd->holdout_best_loss = 3.4028234663852886e+38;
      std::__cxx11::string::string((string *)&__msg,"early_terminate",(allocator *)local_4e8);
      ptVar5 = VW::config::options_i::get_typed_option<unsigned_long>(options,(string *)&__msg);
      peVar1 = (ptVar5->m_value).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (peVar1 == (element_type *)0x0) {
        eVar6 = 0;
      }
      else {
        eVar6 = *peVar1;
      }
      (data._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Head_base<0UL,_gdmf_*,_false>.
      _M_head_impl)->early_stop_thres = eVar6;
      std::__cxx11::string::~string((string *)&__msg);
    }
    std::__cxx11::string::string((string *)&__msg,"learning_rate",&local_4eb);
    iVar4 = (*options->_vptr_options_i[1])(options,&__msg);
    if ((char)iVar4 == '\0') {
      std::__cxx11::string::string(local_4e8,"l",&local_4ec);
      iVar4 = (*options->_vptr_options_i[1])(options,local_4e8);
      std::__cxx11::string::~string(local_4e8);
      std::__cxx11::string::~string((string *)&__msg);
      if ((char)iVar4 == '\0') {
        all->eta = 10.0;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&__msg);
    }
    std::__cxx11::string::string((string *)&__msg,"initial_t",(allocator *)local_4e8);
    iVar4 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar4 == '\0') {
      all->sd->t = 1.0;
      all->initial_t = 1.0;
    }
    fVar10 = powf((float)all->sd->t,all->power_t);
    all->eta = fVar10 * all->eta;
    puVar9 = &(all->weights).dense_weights._stride_shift;
    if ((all->weights).sparse != false) {
      puVar9 = &(all->weights).sparse_weights._stride_shift;
    }
    plVar7 = LEARNER::init_learner<gdmf,example,LEARNER::learner<char,example>>
                       (&data,learn,predict,1L << ((byte)*puVar9 & 0x3f));
    *(code **)(plVar7 + 0x80) = save_load;
    uVar2 = *(undefined8 *)(plVar7 + 0x18);
    uVar3 = *(undefined8 *)(plVar7 + 0x20);
    *(undefined8 *)(plVar7 + 0x70) = uVar2;
    *(undefined8 *)(plVar7 + 0x78) = uVar3;
    *(undefined8 *)(plVar7 + 0x88) = uVar2;
    *(undefined8 *)(plVar7 + 0x90) = uVar3;
    *(code **)(plVar7 + 0x98) = end_pass;
    *(undefined8 *)(plVar7 + 0xb8) = uVar2;
    *(undefined8 *)(plVar7 + 0xc0) = uVar3;
    *(code **)(plVar7 + 200) = finish;
  }
  VW::config::option_group_definition::~option_group_definition(&gf_md_options);
  std::unique_ptr<gdmf,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar7;
}

Assistant:

base_learner* gd_mf_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<gdmf>();

  bool bfgs = false;
  bool conjugate_gradient = false;
  option_group_definition gf_md_options("Gradient Descent Matrix Factorization");
  gf_md_options.add(make_option("rank", data->rank).keep().help("rank for matrix factorization."));

  // Not supported, need to be checked to be false.
  gf_md_options.add(make_option("bfgs", bfgs).help("Option not supported by this reduction"));
  gf_md_options.add(
      make_option("conjugate_gradient", conjugate_gradient).help("Option not supported by this reduction"));
  options.add_and_parse(gf_md_options);

  if (!options.was_supplied("rank"))
    return nullptr;

  if (options.was_supplied("adaptive"))
    THROW("adaptive is not implemented for matrix factorization");
  if (options.was_supplied("normalized"))
    THROW("normalized is not implemented for matrix factorization");
  if (options.was_supplied("exact_adaptive_norm"))
    THROW("normalized adaptive updates is not implemented for matrix factorization");

  if (bfgs || conjugate_gradient)
    THROW("bfgs is not implemented for matrix factorization");

  data->all = &all;
  data->no_win_counter = 0;

  // store linear + 2*rank weights per index, round up to power of two
  float temp = ceilf(logf((float)(data->rank * 2 + 1)) / logf(2.f));
  all.weights.stride_shift((size_t)temp);
  all.random_weights = true;

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    data->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  if (!options.was_supplied("learning_rate") && !options.was_supplied("l"))
    all.eta = 10;  // default learning rate to 10 for non default update rule

  // default initial_t to 1 instead of 0
  if (!options.was_supplied("initial_t"))
  {
    all.sd->t = 1.f;
    all.initial_t = 1.f;
  }
  all.eta *= powf((float)(all.sd->t), all.power_t);

  learner<gdmf, example>& l = init_learner(data, learn, predict, (UINT64_ONE << all.weights.stride_shift()));
  l.set_save_load(save_load);
  l.set_end_pass(end_pass);
  l.set_finish(finish);

  return make_base(l);
}